

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebox.c
# Opt level: O2

int output_cvs(char *fname,int length)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar2 = (ulong)(uint)length;
  __stream = fopen(fname,"w");
  if (__stream == (FILE *)0x0) {
    iVar1 = 0;
  }
  else {
    if (length < 1) {
      uVar2 = 0;
    }
    lVar4 = 0;
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      fprintf(__stream,"%d %d %d\n",uVar3 & 0xffffffff,
              (ulong)(uint)(int)*(short *)((long)stream1 + lVar4),
              (ulong)(uint)(int)*(short *)((long)stream2 + lVar4));
      lVar4 = lVar4 + 2;
    }
    fclose(__stream);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int output_cvs(char *fname, int length)
{
   FILE *fp;
 
   int  i;

   fp = fopen(fname, "w");
   if(fp == NULL) 
      return 0;
   for (i = 0; i < length; i++)
   {
      fprintf(fp, "%d %d %d\n", i, stream1[i], stream2[i]);
   }
   fclose(fp);
   
   return 1;
}